

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  int iVar1;
  ImWchar IVar2;
  int line_start_idx;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float local_54;
  StbTexteditRow local_48;
  
  iVar3 = str->CurLenW;
  local_48.x0 = 0.0;
  local_48.x1 = 0.0;
  local_48.ymin = 0.0;
  local_48.ymax = 0.0;
  local_48.num_chars = 0;
  line_start_idx = 0;
  fVar6 = 0.0;
  while( true ) {
    if (iVar3 <= line_start_idx) {
      return iVar3;
    }
    STB_TEXTEDIT_LAYOUTROW(&local_48,str,line_start_idx);
    iVar1 = local_48.num_chars;
    if (local_48.num_chars < 1) break;
    if ((line_start_idx == 0) && (y < local_48.ymin + fVar6)) {
      return 0;
    }
    if (y < local_48.ymax + fVar6) {
      if (x < local_48.x0) {
        return line_start_idx;
      }
      local_54 = local_48.x0;
      if (x < local_48.x1) {
        iVar4 = -local_48.num_chars;
        iVar3 = 0;
        for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + -1) {
          fVar6 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,iVar3);
          if (x < local_54 + fVar6) {
            if (x < local_54 + fVar6 * 0.5) {
              return line_start_idx - iVar5;
            }
            return (line_start_idx - iVar5) + 1;
          }
          iVar3 = iVar3 + 1;
          local_54 = local_54 + fVar6;
        }
      }
      iVar3 = line_start_idx + iVar1 + -1;
      IVar2 = STB_TEXTEDIT_GETCHAR(str,iVar3);
      if (IVar2 != 10) {
        return iVar1 + line_start_idx;
      }
      return iVar3;
    }
    line_start_idx = line_start_idx + local_48.num_chars;
    fVar6 = fVar6 + local_48.baseline_y_delta;
  }
  return iVar3;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}